

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

wchar_t * makeextralist(wchar_t flags,char *src)

{
  size_t __len;
  wchar_t *__dst;
  size_t sVar1;
  ulong local_50;
  size_t i;
  mbstate_t mbstate;
  wchar_t *s;
  size_t len;
  wchar_t *d;
  wchar_t *dst;
  char *src_local;
  wchar_t *pwStack_10;
  wchar_t flags_local;
  
  dst = (wchar_t *)src;
  src_local._4_4_ = flags;
  __len = strlen(src);
  __dst = (wchar_t *)calloc(__len + 0x1e,4);
  if (__dst == (wchar_t *)0x0) {
    pwStack_10 = (wchar_t *)0x0;
  }
  else {
    memset(&i,0,8);
    if (((src_local._4_4_ & 0x4000U) == 0) &&
       (sVar1 = mbsrtowcs(__dst,(char **)&dst,__len,(mbstate_t *)&i), sVar1 != 0xffffffffffffffff))
    {
      __len = wcslen(__dst);
    }
    else {
      for (local_50 = 0; local_50 < __len; local_50 = local_50 + 1) {
        __dst[local_50] = (uint)*(byte *)((long)dst + local_50);
      }
    }
    len = (size_t)(__dst + __len);
    if ((src_local._4_4_ & 0x1000U) != 0) {
      mbstate = (mbstate_t)char_glob;
      while (*(int *)mbstate != 0) {
        *(undefined4 *)len = *(undefined4 *)mbstate;
        mbstate = (mbstate_t)((long)mbstate + 4);
        len = len + 4;
      }
    }
    if ((src_local._4_4_ & 0x2000U) != 0) {
      mbstate = (mbstate_t)char_shell;
      while (*(int *)mbstate != 0) {
        *(undefined4 *)len = *(undefined4 *)mbstate;
        mbstate = (mbstate_t)((long)mbstate + 4);
        len = len + 4;
      }
    }
    if ((src_local._4_4_ & 4U) != 0) {
      *(undefined4 *)len = 0x20;
      len = len + 4;
    }
    if ((src_local._4_4_ & 8U) != 0) {
      *(undefined4 *)len = 9;
      len = len + 4;
    }
    if ((src_local._4_4_ & 0x10U) != 0) {
      *(undefined4 *)len = 10;
      len = len + 4;
    }
    if ((src_local._4_4_ & 0x8000U) != 0) {
      *(undefined4 *)len = 0x22;
      len = len + 4;
    }
    if ((src_local._4_4_ & 0x40U) == 0) {
      *(undefined4 *)len = 0x5c;
      len = len + 4;
    }
    *(undefined4 *)len = 0;
    pwStack_10 = __dst;
  }
  return pwStack_10;
}

Assistant:

static wchar_t *
makeextralist(int flags, const char *src)
{
	wchar_t *dst, *d;
	size_t len;
	const wchar_t *s;
	mbstate_t mbstate;

	len = strlen(src);
	if ((dst = calloc(len + MAXEXTRAS, sizeof(*dst))) == NULL)
		return NULL;

	memset(&mbstate, 0, sizeof(mbstate));
	if ((flags & VIS_NOLOCALE)
	    || mbsrtowcs(dst, &src, len, &mbstate) == (size_t)-1) {
		size_t i;
		for (i = 0; i < len; i++)
			dst[i] = (wchar_t)(u_char)src[i];
		d = dst + len;
	} else
		d = dst + wcslen(dst);

	if (flags & VIS_GLOB)
		for (s = char_glob; *s; *d++ = *s++)
			continue;

	if (flags & VIS_SHELL)
		for (s = char_shell; *s; *d++ = *s++)
			continue;

	if (flags & VIS_SP) *d++ = L' ';
	if (flags & VIS_TAB) *d++ = L'\t';
	if (flags & VIS_NL) *d++ = L'\n';
	if (flags & VIS_DQ) *d++ = L'"';
	if ((flags & VIS_NOSLASH) == 0) *d++ = L'\\';
	*d = L'\0';

	return dst;
}